

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.c
# Opt level: O0

stream * GetStream(anynode *AnyNode,tchar_t *URL,int Flags)

{
  fourcc_t ClassId;
  stream *psVar1;
  fourcc_t FourCC;
  stream *Stream;
  tchar_t Protocol [16];
  int Flags_local;
  tchar_t *URL_local;
  anynode *AnyNode_local;
  
  GetProtocol(URL,(tchar_t *)&Stream,0x10,(bool_t *)0x0);
  ClassId = NodeEnumClassStr(AnyNode,(array *)0x0,0x4d525453,4,(tchar_t *)&Stream);
  psVar1 = (stream *)NodeCreate(AnyNode,ClassId);
  if ((psVar1 != (stream *)0x0) && ((Flags & 0x1000U) != 0)) {
    if (psVar1 == (stream *)0x0) {
      __assert_fail("(const void*)(Stream)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/streams.c"
                    ,0xf7,"stream *GetStream(anynode *, const tchar_t *, int)");
    }
    (**(code **)((long)(psVar1->Base).VMT + 0x90))(psVar1,0);
  }
  if ((psVar1 == (stream *)0x0) && ((Flags & 8U) == 0)) {
    tcsupr((tchar_t *)&Stream);
    NodeReportError(AnyNode,(node *)0x0,0x5f525245,-0xd,&Stream);
  }
  if (psVar1 != (stream *)0x0) {
    tcscpy_s(psVar1->URL,0x100,URL);
  }
  return psVar1;
}

Assistant:

stream* GetStream(anynode *AnyNode, const tchar_t* URL, int Flags)
{
    tchar_t Protocol[MAXPROTOCOL];
    stream* Stream = NULL;
    fourcc_t FourCC;

    GetProtocol(URL,Protocol,TSIZEOF(Protocol),NULL);

    FourCC = NodeEnumClassStr(AnyNode,NULL,STREAM_CLASS,NODE_PROTOCOL,Protocol);

#if defined(CONFIG_STREAM_CACHE)
    if ((Flags & (SFLAG_NO_CACHING|SFLAG_WRONLY|SFLAG_CREATE))==0)
        Stream = (stream*)NodeCreate(AnyNode,NodeClass_Meta(NodeContext_FindClass(AnyNode,FourCC),STREAM_CACHE_CLASS,META_PARAM_CUSTOM));
#endif

    if (!Stream)
        Stream = (stream*)NodeCreate(AnyNode,FourCC);

    if (Stream && (Flags & SFLAG_NON_BLOCKING))
        Stream_Blocking(Stream,0);

    if (!Stream && !(Flags & SFLAG_SILENT))
    {
        tcsupr(Protocol);
        NodeReportError(AnyNode,NULL,ERR_ID,ERR_PROTO_NOT_FOUND,Protocol);
    }
#if defined(CONFIG_DEBUGCHECKS)
    if (Stream)
        tcscpy_s(Stream->URL,TSIZEOF(Stream->URL),URL);
#endif
    return Stream;
}